

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O3

uint64_t Assimp::FBX::anon_unknown_3::ReadDoubleWord(char *input,char **cursor,char *end)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  string local_40;
  
  puVar1 = (uint64_t *)*cursor;
  if (7 < (ulong)((long)end - (long)puVar1)) {
    uVar2 = *puVar1;
    *cursor = (char *)(puVar1 + 1);
    return uVar2;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"cannot ReadDoubleWord, out of bounds","");
  TokenizeError(&local_40,(long)*cursor - (long)input);
}

Assistant:

uint64_t ReadDoubleWord(const char* input, const char*& cursor, const char* end) {
    const size_t k_to_read = sizeof(uint64_t);
    if(Offset(cursor, end) < k_to_read) {
        TokenizeError("cannot ReadDoubleWord, out of bounds",input, cursor);
    }

    uint64_t dword /*= *reinterpret_cast<const uint64_t*>(cursor)*/;
    ::memcpy( &dword, cursor, sizeof( uint64_t ) );
    AI_SWAP8(dword);

    cursor += k_to_read;

    return dword;
}